

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot.c
# Opt level: O1

void faup_snapshot_item_debug(faup_snapshot_item_t *item)

{
  faup_snapshot_value_count_t *vc;
  htable_iter iter;
  htable_iter hStack_18;
  
  if (item != (faup_snapshot_item_t *)0x0) {
    puts("** \titem");
    printf("** \tkey:%s\n",item->key);
    printf("** \tlength:%ld\n",item->length);
    if (item->length != 0) {
      vc = (faup_snapshot_value_count_t *)htable_first(&item->values,&hStack_18);
      while (vc != (faup_snapshot_value_count_t *)0x0) {
        faup_snapshot_value_count_debug(vc);
        vc = (faup_snapshot_value_count_t *)htable_next(&item->values,&hStack_18);
      }
    }
    return;
  }
  puts("** item empty, cannot debug!");
  return;
}

Assistant:

void faup_snapshot_item_debug(faup_snapshot_item_t *item)
{
  struct htable_iter iter;
  faup_snapshot_value_count_t *vc;
  
  if (!item) {
    printf("** item empty, cannot debug!\n");
    return;
  }
  
  printf("** \titem\n");
  printf("** \tkey:%s\n", item->key);
  printf("** \tlength:%ld\n", item->length);

  if (item->length) {
    vc = htable_first(&item->values, &iter);
    while (vc) {
      faup_snapshot_value_count_debug(vc);
      vc = htable_next(&item->values, &iter);
    }
  }
}